

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tool_writeout.c
# Opt level: O2

int writeString(FILE *stream,writeoutvar *wovar,per_transfer *per,CURLcode per_result,_Bool use_json
               )

{
  int *piVar1;
  CURLINFO CVar2;
  writeoutid wVar3;
  uint uVar4;
  curl_slist *pcVar5;
  char **ppcVar6;
  int iVar7;
  CURLcode CVar8;
  httpmap *m;
  httpmap *phVar9;
  long lVar10;
  char *pcVar11;
  curl_certinfo *pcVar12;
  size_t sVar13;
  char *pcVar14;
  undefined3 in_register_00000081;
  undefined4 uVar15;
  curl_slist **ppcVar16;
  bool bVar17;
  char *local_90;
  undefined4 local_84;
  char *local_80;
  long version;
  writeoutvar *local_70;
  FILE *local_68;
  per_transfer *local_60;
  long local_58;
  dynbuf buf;
  
  uVar15 = CONCAT31(in_register_00000081,use_json);
  local_90 = (char *)0x0;
  curlx_dyn_init(&buf,0x40000);
  CVar2 = wovar->ci;
  if (CVar2 != CURLINFO_NONE) {
    if (CVar2 == CURLINFO_HTTP_VERSION) {
      version = 0;
      iVar7 = curl_easy_getinfo(per->curl,0x20002e);
      if (iVar7 == 0) {
        phVar9 = http_version;
        do {
          ppcVar6 = &phVar9->str;
          if (*ppcVar6 == (char *)0x0) goto switchD_0011d367_caseD_3;
          piVar1 = &phVar9->num;
          phVar9 = phVar9 + 1;
          pcVar11 = *ppcVar6;
        } while (version != *piVar1);
        goto LAB_0011d5ca;
      }
      goto switchD_0011d367_caseD_3;
    }
    pcVar14 = (char *)0x0;
    iVar7 = curl_easy_getinfo(per->curl,CVar2,&local_90);
    pcVar11 = local_90;
    if (iVar7 != 0 || local_90 == (char *)0x0) goto switchD_0011d367_caseD_3;
    goto LAB_0011d5d1;
  }
  wVar3 = wovar->id;
  switch(wVar3) {
  case VAR_CERT:
    certinfo(per);
    pcVar12 = per->certinfo;
    if (pcVar12 == (curl_certinfo *)0x0) {
      local_90 = "";
    }
    else {
      lVar10 = 0;
      bVar17 = false;
      local_84 = uVar15;
      local_70 = wovar;
      local_68 = (FILE *)stream;
      local_60 = per;
      while ((stream = (FILE *)local_68, wovar = local_70, uVar15 = local_84,
             lVar10 < pcVar12->num_of_certs && (!bVar17))) {
        ppcVar16 = pcVar12->certinfo + lVar10;
        local_58 = lVar10;
        while( true ) {
          pcVar5 = *ppcVar16;
          bVar17 = pcVar5 != (curl_slist *)0x0;
          if (pcVar5 == (curl_slist *)0x0) break;
          iVar7 = curl_strnequal(pcVar5->data,"cert:",5);
          pcVar11 = pcVar5->data;
          if (iVar7 != 0) {
            pcVar11 = pcVar11 + 5;
          }
          CVar8 = curlx_dyn_add(&buf,pcVar11);
          if ((CVar8 != CURLE_OK) ||
             (((sVar13 = curlx_dyn_len(&buf), sVar13 != 0 &&
               (pcVar11 = curlx_dyn_ptr(&buf), pcVar11[sVar13 - 1] != '\n')) &&
              (CVar8 = curlx_dyn_addn(&buf,"\n",1), CVar8 != CURLE_OK)))) break;
          ppcVar16 = &pcVar5->next;
        }
        lVar10 = local_58 + 1;
        pcVar12 = local_60->certinfo;
      }
      if (!bVar17) {
        pcVar14 = curlx_dyn_ptr(&buf);
        pcVar11 = "";
        if (pcVar14 != (char *)0x0) {
          pcVar11 = pcVar14;
        }
        goto LAB_0011d5ca;
      }
    }
    break;
  case VAR_EFFECTIVE_FILENAME:
    pcVar11 = (per->outs).filename;
    goto LAB_0011d5c1;
  case VAR_ERRORMSG:
    if (per_result == CURLE_OK) break;
    pcVar11 = per->errorbuffer;
    if ((pcVar11 == (char *)0x0) || (*pcVar11 == '\0')) {
      pcVar11 = (char *)curl_easy_strerror(per_result);
    }
    goto LAB_0011d5ca;
  case VAR_INPUT_URL:
    pcVar11 = per->this_url;
LAB_0011d5c1:
    if (pcVar11 != (char *)0x0) {
LAB_0011d5ca:
      pcVar14 = (char *)0x0;
      local_90 = pcVar11;
LAB_0011d5d1:
      if ((char)uVar15 == '\0') {
        fputs(pcVar11,(FILE *)stream);
      }
      else {
        curl_mfprintf(stream,"\"%s\":",wovar->name);
        jsonWriteString(stream,local_90,false);
      }
      goto LAB_0011d607;
    }
    break;
  case VAR_INPUT_URLSCHEME:
  case VAR_INPUT_URLUSER:
  case VAR_INPUT_URLPASSWORD:
  case VAR_INPUT_URLOPTIONS:
  case VAR_INPUT_URLHOST:
  case VAR_INPUT_URLPORT:
  case VAR_INPUT_URLPATH:
  case VAR_INPUT_URLQUERY:
  case VAR_INPUT_URLFRAGMENT:
  case VAR_INPUT_URLZONEID:
  case VAR_INPUT_URLESCHEME:
  case VAR_INPUT_URLEUSER:
  case VAR_INPUT_URLEPASSWORD:
  case VAR_INPUT_URLEOPTIONS:
  case VAR_INPUT_URLEHOST:
  case VAR_INPUT_URLEPORT:
  case VAR_INPUT_URLEPATH:
  case VAR_INPUT_URLEQUERY:
  case VAR_INPUT_URLEFRAGMENT:
  case VAR_INPUT_URLEZONEID:
    if ((per->this_url != (char *)0x0) && (lVar10 = curl_url(), lVar10 != 0)) {
      version = 0;
      local_80 = (char *)0x0;
      if (wVar3 < VAR_INPUT_URLESCHEME) {
        local_80 = per->this_url;
        local_84 = uVar15;
LAB_0011d3f9:
        uVar4 = (&UINT_00139760)[(int)wVar3];
        iVar7 = curl_url_set(lVar10,0,local_80,0x208);
        if (iVar7 == 0) {
          iVar7 = curl_url_get(lVar10,uVar4,&version,1);
          bVar17 = iVar7 == 0;
          if (version == 0 || !bVar17) goto LAB_0011d45b;
          local_90 = (char *)version;
          bVar17 = true;
          pcVar14 = (char *)version;
        }
        else {
          bVar17 = false;
          pcVar14 = (char *)0x0;
        }
      }
      else {
        bVar17 = false;
        local_84 = uVar15;
        iVar7 = curl_easy_getinfo(per->curl,0x100001,&local_80);
        if (iVar7 == 0) goto LAB_0011d3f9;
LAB_0011d45b:
        pcVar14 = (char *)0x0;
      }
      curl_url_cleanup(lVar10);
      pcVar11 = pcVar14;
      uVar15 = local_84;
      if (bVar17) goto LAB_0011d5d1;
    }
  }
switchD_0011d367_caseD_3:
  if ((char)uVar15 == '\0') {
    pcVar14 = (char *)0x0;
  }
  else {
    pcVar14 = (char *)0x0;
    curl_mfprintf(stream,"\"%s\":null",wovar->name);
  }
LAB_0011d607:
  curl_free(pcVar14);
  curlx_dyn_free(&buf);
  return 1;
}

Assistant:

static int writeString(FILE *stream, const struct writeoutvar *wovar,
                       struct per_transfer *per, CURLcode per_result,
                       bool use_json)
{
  bool valid = false;
  const char *strinfo = NULL;
  const char *freestr = NULL;
  struct dynbuf buf;
  curlx_dyn_init(&buf, 256*1024);

  DEBUGASSERT(wovar->writefunc == writeString);

  if(wovar->ci) {
    if(wovar->ci == CURLINFO_HTTP_VERSION) {
      long version = 0;
      if(!curl_easy_getinfo(per->curl, CURLINFO_HTTP_VERSION, &version)) {
        const struct httpmap *m = &http_version[0];
        while(m->str) {
          if(m->num == version) {
            strinfo = m->str;
            valid = true;
            break;
          }
          m++;
        }
      }
    }
    else {
      if(!curl_easy_getinfo(per->curl, wovar->ci, &strinfo) && strinfo)
        valid = true;
    }
  }
  else {
    switch(wovar->id) {
    case VAR_CERT:
      certinfo(per);
      if(per->certinfo) {
        int i;
        bool error = FALSE;
        for(i = 0; (i < per->certinfo->num_of_certs) && !error; i++) {
          struct curl_slist *slist;

          for(slist = per->certinfo->certinfo[i]; slist; slist = slist->next) {
            size_t len;
            if(curl_strnequal(slist->data, "cert:", 5)) {
              if(curlx_dyn_add(&buf, &slist->data[5])) {
                error = TRUE;
                break;
              }
            }
            else {
              if(curlx_dyn_add(&buf, slist->data)) {
                error = TRUE;
                break;
              }
            }
            len = curlx_dyn_len(&buf);
            if(len) {
              char *ptr = curlx_dyn_ptr(&buf);
              if(ptr[len -1] != '\n') {
                /* add a newline to make things look better */
                if(curlx_dyn_addn(&buf, "\n", 1)) {
                  error = TRUE;
                  break;
                }
              }
            }
          }
        }
        if(!error) {
          strinfo = curlx_dyn_ptr(&buf);
          if(!strinfo)
            /* maybe not a TLS protocol */
            strinfo = "";
          valid = true;
        }
      }
      else
        strinfo = ""; /* no cert info */
      break;
    case VAR_ERRORMSG:
      if(per_result) {
        strinfo = (per->errorbuffer && per->errorbuffer[0]) ?
          per->errorbuffer : curl_easy_strerror(per_result);
        valid = true;
      }
      break;
    case VAR_EFFECTIVE_FILENAME:
      if(per->outs.filename) {
        strinfo = per->outs.filename;
        valid = true;
      }
      break;
    case VAR_INPUT_URL:
      if(per->this_url) {
        strinfo = per->this_url;
        valid = true;
      }
      break;
    case VAR_INPUT_URLSCHEME:
    case VAR_INPUT_URLUSER:
    case VAR_INPUT_URLPASSWORD:
    case VAR_INPUT_URLOPTIONS:
    case VAR_INPUT_URLHOST:
    case VAR_INPUT_URLPORT:
    case VAR_INPUT_URLPATH:
    case VAR_INPUT_URLQUERY:
    case VAR_INPUT_URLFRAGMENT:
    case VAR_INPUT_URLZONEID:
    case VAR_INPUT_URLESCHEME:
    case VAR_INPUT_URLEUSER:
    case VAR_INPUT_URLEPASSWORD:
    case VAR_INPUT_URLEOPTIONS:
    case VAR_INPUT_URLEHOST:
    case VAR_INPUT_URLEPORT:
    case VAR_INPUT_URLEPATH:
    case VAR_INPUT_URLEQUERY:
    case VAR_INPUT_URLEFRAGMENT:
    case VAR_INPUT_URLEZONEID:
      if(per->this_url) {
        if(!urlpart(per, wovar->id, &strinfo)) {
          freestr = strinfo;
          valid = true;
        }
      }
      break;
    default:
      DEBUGASSERT(0);
      break;
    }
  }

  if(valid) {
    DEBUGASSERT(strinfo);
    if(use_json) {
      fprintf(stream, "\"%s\":", wovar->name);
      jsonWriteString(stream, strinfo, FALSE);
    }
    else
      fputs(strinfo, stream);
  }
  else {
    if(use_json)
      fprintf(stream, "\"%s\":null", wovar->name);
  }
  curl_free((char *)freestr);

  curlx_dyn_free(&buf);
  return 1; /* return 1 if anything was written */
}